

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_test.cpp
# Opt level: O0

void test_number(void)

{
  bool bVar1;
  int iVar2;
  value_t *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 extraout_var;
  double dVar6;
  value_equal_to_t local_c1;
  number_t local_c0;
  value_equal_to_t local_a3;
  value_hash_t local_a2;
  value_hash_t local_a1;
  value_t *local_a0;
  value_t *copy;
  number_t local_80;
  value_t *local_68;
  value_t *item;
  number_t local_48;
  number_t local_20;
  
  deci::number_t::number_t(&local_20,100.0);
  dVar6 = deci::number_t::Value(&local_20);
  if ((dVar6 != 100.0) || (NAN(dVar6))) {
    __assert_fail("number_t(100.0).Value() == 100.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x11,"void test_number()");
  }
  deci::number_t::~number_t(&local_20);
  deci::number_t::number_t(&local_48,200.0);
  dVar6 = deci::number_t::Value(&local_48);
  if ((dVar6 != 200.0) || (NAN(dVar6))) {
    __assert_fail("number_t(200.0).Value() == 200.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x12,"void test_number()");
  }
  deci::number_t::~number_t(&local_48);
  deci::number_t::number_t((number_t *)&item,0.0);
  dVar6 = deci::number_t::Value((number_t *)&item);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    __assert_fail("number_t(0.0).Value() == 0.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x13,"void test_number()");
  }
  deci::number_t::~number_t((number_t *)&item);
  deci::number_t::number_t(&local_80,123.0);
  pvVar3 = deci::number_t::Copy(&local_80);
  deci::number_t::~number_t(&local_80);
  local_68 = pvVar3;
  iVar2 = (*pvVar3->_vptr_value_t[1])();
  if (iVar2 != 0) {
    __assert_fail("item->Type() == value_t::NUMBER",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x16,"void test_number()");
  }
  sVar4 = deci::value_t::Hash(local_68);
  deci::number_t::number_t((number_t *)&copy,123.0);
  sVar5 = deci::value_t::Hash((value_t *)&copy);
  if (sVar4 == sVar5) {
    deci::number_t::~number_t((number_t *)&copy);
    iVar2 = (*local_68->_vptr_value_t[2])();
    local_a0 = (value_t *)CONCAT44(extraout_var,iVar2);
    if (local_68 == local_a0) {
      __assert_fail("item != copy",
                    "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                    ,0x19,"void test_number()");
    }
    sVar4 = deci::value_hash_t::operator()(&local_a1,local_68);
    sVar5 = deci::value_hash_t::operator()(&local_a2,local_a0);
    if (sVar4 != sVar5) {
      __assert_fail("value_hash_t()(item) == value_hash_t()(copy)",
                    "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                    ,0x1a,"void test_number()");
    }
    bVar1 = deci::value_equal_to_t::operator()(&local_a3,local_68,local_a0);
    if (!bVar1) {
      __assert_fail("value_equal_to_t()(item, copy) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                    ,0x1b,"void test_number()");
    }
    (*local_a0->_vptr_value_t[3])();
    deci::number_t::number_t(&local_c0,100.0);
    local_a0 = deci::number_t::Copy(&local_c0);
    deci::number_t::~number_t(&local_c0);
    bVar1 = deci::value_equal_to_t::operator()(&local_c1,local_68,local_a0);
    if (!bVar1) {
      (*local_a0->_vptr_value_t[3])();
      (*local_68->_vptr_value_t[3])();
      return;
    }
    __assert_fail("value_equal_to_t()(item, copy) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                  ,0x1f,"void test_number()");
  }
  __assert_fail("item->Hash() == number_t(123.0).Hash()",
                "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/test/values_test.cpp"
                ,0x17,"void test_number()");
}

Assistant:

void test_number() {
  using namespace deci;

  assert(number_t(100.0).Value() == 100.0);
  assert(number_t(200.0).Value() == 200.0);
  assert(number_t(0.0).Value() == 0.0);

  value_t* item = number_t(123.0).Copy();
  assert(item->Type() == value_t::NUMBER);
  assert(item->Hash() == number_t(123.0).Hash());
  value_t* copy = item->Copy();
  assert(item != copy);
  assert(value_hash_t()(item) == value_hash_t()(copy));
  assert(value_equal_to_t()(item, copy) == true);

  copy->Delete();
  copy = number_t(100.0).Copy();
  assert(value_equal_to_t()(item, copy) == false);

  copy->Delete();
  item->Delete();
}